

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

int_type __thiscall
nlohmann::detail::input_stream_adapter::get_character(input_stream_adapter *this)

{
  int iVar1;
  
  iVar1 = std::streambuf::sbumpc();
  if (iVar1 == -1) {
    std::ios::clear((int)this->is + (int)*(undefined8 *)(*(long *)this->is + -0x18));
  }
  return iVar1;
}

Assistant:

std::char_traits<char>::int_type get_character()
{
auto res = sb->sbumpc();
// set eof manually, as we don't use the istream interface.
if (JSON_HEDLEY_UNLIKELY(res == EOF))
{
is->clear(is->rdstate() | std::ios::eofbit);
}
return res;
}